

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.cc
# Opt level: O0

void load_GL_NV_viewport_array(GLADloadproc load)

{
  code *in_RDI;
  
  if (GLAD_GL_NV_viewport_array != 0) {
    glad_glViewportArrayvNV = (PFNGLVIEWPORTARRAYVNVPROC)(*in_RDI)("glViewportArrayvNV");
    glad_glViewportIndexedfNV = (PFNGLVIEWPORTINDEXEDFNVPROC)(*in_RDI)("glViewportIndexedfNV");
    glad_glViewportIndexedfvNV = (PFNGLVIEWPORTINDEXEDFVNVPROC)(*in_RDI)("glViewportIndexedfvNV");
    glad_glScissorArrayvNV = (PFNGLSCISSORARRAYVNVPROC)(*in_RDI)("glScissorArrayvNV");
    glad_glScissorIndexedNV = (PFNGLSCISSORINDEXEDNVPROC)(*in_RDI)("glScissorIndexedNV");
    glad_glScissorIndexedvNV = (PFNGLSCISSORINDEXEDVNVPROC)(*in_RDI)("glScissorIndexedvNV");
    glad_glDepthRangeArrayfvNV = (PFNGLDEPTHRANGEARRAYFVNVPROC)(*in_RDI)("glDepthRangeArrayfvNV");
    glad_glDepthRangeIndexedfNV = (PFNGLDEPTHRANGEINDEXEDFNVPROC)(*in_RDI)("glDepthRangeIndexedfNV")
    ;
    glad_glGetFloati_vNV = (PFNGLGETFLOATI_VNVPROC)(*in_RDI)("glGetFloati_vNV");
    glad_glEnableiNV = (PFNGLENABLEINVPROC)(*in_RDI)("glEnableiNV");
    glad_glDisableiNV = (PFNGLDISABLEINVPROC)(*in_RDI)("glDisableiNV");
    glad_glIsEnablediNV = (PFNGLISENABLEDINVPROC)(*in_RDI)("glIsEnablediNV");
  }
  return;
}

Assistant:

static void load_GL_NV_viewport_array(GLADloadproc load) {
	if(!GLAD_GL_NV_viewport_array) return;
	glad_glViewportArrayvNV = (PFNGLVIEWPORTARRAYVNVPROC)load("glViewportArrayvNV");
	glad_glViewportIndexedfNV = (PFNGLVIEWPORTINDEXEDFNVPROC)load("glViewportIndexedfNV");
	glad_glViewportIndexedfvNV = (PFNGLVIEWPORTINDEXEDFVNVPROC)load("glViewportIndexedfvNV");
	glad_glScissorArrayvNV = (PFNGLSCISSORARRAYVNVPROC)load("glScissorArrayvNV");
	glad_glScissorIndexedNV = (PFNGLSCISSORINDEXEDNVPROC)load("glScissorIndexedNV");
	glad_glScissorIndexedvNV = (PFNGLSCISSORINDEXEDVNVPROC)load("glScissorIndexedvNV");
	glad_glDepthRangeArrayfvNV = (PFNGLDEPTHRANGEARRAYFVNVPROC)load("glDepthRangeArrayfvNV");
	glad_glDepthRangeIndexedfNV = (PFNGLDEPTHRANGEINDEXEDFNVPROC)load("glDepthRangeIndexedfNV");
	glad_glGetFloati_vNV = (PFNGLGETFLOATI_VNVPROC)load("glGetFloati_vNV");
	glad_glEnableiNV = (PFNGLENABLEINVPROC)load("glEnableiNV");
	glad_glDisableiNV = (PFNGLDISABLEINVPROC)load("glDisableiNV");
	glad_glIsEnablediNV = (PFNGLISENABLEDINVPROC)load("glIsEnablediNV");
}